

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImRect::Add(ImRect *this,ImVec2 *rhs)

{
  float fVar1;
  ImVec2 *rhs_local;
  ImRect *this_local;
  
  fVar1 = (this->Min).x;
  if (rhs->x <= fVar1 && fVar1 != rhs->x) {
    (this->Min).x = rhs->x;
  }
  fVar1 = (this->Min).y;
  if (rhs->y <= fVar1 && fVar1 != rhs->y) {
    (this->Min).y = rhs->y;
  }
  if ((this->Max).x < rhs->x) {
    (this->Max).x = rhs->x;
  }
  if ((this->Max).y < rhs->y) {
    (this->Max).y = rhs->y;
  }
  return;
}

Assistant:

void        Add(const ImVec2& rhs)          { if (Min.x > rhs.x)     Min.x = rhs.x;     if (Min.y > rhs.y) Min.y = rhs.y;         if (Max.x < rhs.x) Max.x = rhs.x;         if (Max.y < rhs.y) Max.y = rhs.y; }